

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deUniquePtr.hpp
# Opt level: O1

void __thiscall
de::details::
UniqueBase<vk::DescriptorSetLayoutBuilder,_de::DefaultDeleter<vk::DescriptorSetLayoutBuilder>_>::
reset(UniqueBase<vk::DescriptorSetLayoutBuilder,_de::DefaultDeleter<vk::DescriptorSetLayoutBuilder>_>
      *this)

{
  DescriptorSetLayoutBuilder *pDVar1;
  pointer pHVar2;
  pointer pIVar3;
  void *pvVar4;
  
  pDVar1 = (this->m_data).ptr;
  if (pDVar1 != (DescriptorSetLayoutBuilder *)0x0) {
    pHVar2 = (pDVar1->m_immutableSamplers).
             super__Vector_base<vk::Handle<(vk::HandleType)20>,_std::allocator<vk::Handle<(vk::HandleType)20>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    if (pHVar2 != (pointer)0x0) {
      operator_delete(pHVar2,(long)(pDVar1->m_immutableSamplers).
                                   super__Vector_base<vk::Handle<(vk::HandleType)20>,_std::allocator<vk::Handle<(vk::HandleType)20>_>_>
                                   ._M_impl.super__Vector_impl_data._M_end_of_storage - (long)pHVar2
                     );
    }
    pIVar3 = (pDVar1->m_immutableSamplerInfos).
             super__Vector_base<vk::DescriptorSetLayoutBuilder::ImmutableSamplerInfo,_std::allocator<vk::DescriptorSetLayoutBuilder::ImmutableSamplerInfo>_>
             ._M_impl.super__Vector_impl_data._M_start;
    if (pIVar3 != (pointer)0x0) {
      operator_delete(pIVar3,(long)(pDVar1->m_immutableSamplerInfos).
                                   super__Vector_base<vk::DescriptorSetLayoutBuilder::ImmutableSamplerInfo,_std::allocator<vk::DescriptorSetLayoutBuilder::ImmutableSamplerInfo>_>
                                   ._M_impl.super__Vector_impl_data._M_end_of_storage - (long)pIVar3
                     );
    }
    pvVar4 = (pDVar1->m_bindings).
             super__Vector_base<vk::VkDescriptorSetLayoutBinding,_std::allocator<vk::VkDescriptorSetLayoutBinding>_>
             ._M_impl.super__Vector_impl_data._M_start;
    if (pvVar4 != (void *)0x0) {
      operator_delete(pvVar4,(long)(pDVar1->m_bindings).
                                   super__Vector_base<vk::VkDescriptorSetLayoutBinding,_std::allocator<vk::VkDescriptorSetLayoutBinding>_>
                                   ._M_impl.super__Vector_impl_data._M_end_of_storage - (long)pvVar4
                     );
    }
    operator_delete(pDVar1,0x48);
    (this->m_data).ptr = (DescriptorSetLayoutBuilder *)0x0;
  }
  return;
}

Assistant:

void UniqueBase<T, D>::reset (void)
{
	if (m_data.ptr != DE_NULL)
	{
		m_data.deleter(m_data.ptr);
		m_data.ptr = DE_NULL;
	}
}